

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O1

string * __thiscall
pbrt::HairBxDF::ToString_abi_cxx11_(string *__return_storage_ptr__,HairBxDF *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<float_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&,pbrt::SampledSpectrum_const&>
            (__return_storage_ptr__,
             "[ HairBxDF h: %f gamma_o: %f eta: %f beta_m: %f beta_n: %f v[0]: %f s: %f sigma_a: %s ]"
             ,&this->h,&this->gamma_o,&this->eta,&this->beta_m,&this->beta_n,this->v,&this->s,
             &this->sigma_a);
  return __return_storage_ptr__;
}

Assistant:

std::string HairBxDF::ToString() const {
    return StringPrintf("[ HairBxDF h: %f gamma_o: %f eta: %f beta_m: %f beta_n: %f "
                        "v[0]: %f s: %f sigma_a: %s ]",
                        h, gamma_o, eta, beta_m, beta_n, v[0], s, sigma_a);
}